

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void av1_fwd_txfm2d_16x8_avx2(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  code *pcVar1;
  code *pcVar2;
  int8_t *piVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  int iVar6;
  int iVar7;
  __m256i in [16];
  __m256i out [16];
  longlong local_460 [32];
  longlong local_360 [32];
  longlong local_260 [4];
  longlong local_240 [66];
  
  piVar3 = av1_fwd_txfm_shift_ls[8];
  iVar6 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar4 = iVar6 - 4;
  uVar5 = (ulong)(uint)(iVar6 << 3);
  pcVar1 = *(code **)((long)col_highbd_txfm8x8_arr + uVar5);
  pcVar2 = *(code **)((long)row_highbd_txfm8x16_arr + uVar5);
  iVar6 = 0;
  iVar7 = 0;
  if ((byte)uVar4 < 0xc) {
    uVar4 = (uVar4 & 0xff) << 2;
    iVar6 = *(int *)(&DAT_004bd884 + uVar4);
    iVar7 = *(int *)(&DAT_004bd8b4 + uVar4);
  }
  load_buffer_16xn_avx2(input,(__m256i *)local_460,stride,8,2,iVar6,iVar7);
  iVar7 = 1;
  round_shift_32_8xn_avx2((__m256i *)local_460,0x10,(int)*piVar3,1);
  (*pcVar1)((__m256i *)local_460,&local_260,0xd,2,2);
  round_shift_32_8xn_avx2(&local_260,0x10,(int)piVar3[1],1);
  fwd_txfm_transpose_8x8_avx2(&local_260,(__m256i *)local_460,2,1);
  fwd_txfm_transpose_8x8_avx2((__m256i *)local_240,(__m256i *)local_360,2,1);
  iVar6 = iVar7;
  (*pcVar2)(local_460,&local_260,0xd);
  round_shift_rect_array_32_avx2(&local_260,&local_260,-(int)piVar3[2],iVar6,iVar7);
  store_buffer_avx2(&local_260,coeff,0x10,iVar6);
  return;
}

Assistant:

void av1_fwd_txfm2d_16x8_avx2(const int16_t *input, int32_t *coeff, int stride,
                              TX_TYPE tx_type, int bd) {
  __m256i in[16], out[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X8];
  const int txw_idx = get_txw_idx(TX_16X8);
  const int txh_idx = get_txh_idx(TX_16X8);
  const transform_1d_avx2 col_txfm = col_highbd_txfm8x8_arr[tx_type];
  const transform_1d_avx2 row_txfm = row_highbd_txfm8x16_arr[tx_type];
  const int8_t bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_16xn_avx2(input, in, stride, 8, 2, ud_flip, lr_flip);
  round_shift_32_8xn_avx2(in, 16, shift[0], 1);
  col_txfm(in, out, bit, 2, 2);
  round_shift_32_8xn_avx2(out, 16, shift[1], 1);
  fwd_txfm_transpose_8x8_avx2(out, in, 2, 1);
  fwd_txfm_transpose_8x8_avx2(&out[1], &in[8], 2, 1);
  row_txfm(in, out, bit, 1, 1);
  round_shift_rect_array_32_avx2(out, out, 16, -shift[2], NewSqrt2);
  store_buffer_avx2(out, coeff, 8, 16);
  (void)bd;
}